

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateInterface
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Descriptor *descriptor;
  Context *pCVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  MessageOptions *pMVar6;
  char *pcVar7;
  string *psVar8;
  FieldDescriptor *field;
  ImmutableFieldLiteGenerator *pIVar9;
  OneofDescriptor *oneof;
  OneofGeneratorInfo *pOVar10;
  ClassNameResolver *this_00;
  Descriptor *descriptor_00;
  Descriptor *descriptor_01;
  string local_158;
  int local_134;
  int local_130;
  int i_1;
  int i;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  descriptor = (this->super_MessageGenerator).descriptor_;
  pCVar1 = this->context_;
  local_18 = printer;
  printer_local = (Printer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"OrBuilder",&local_39);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (pCVar1,printer,descriptor,true,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  iVar4 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  pPVar2 = local_18;
  if (iVar4 < 1) {
    pMVar6 = Descriptor::options((this->super_MessageGenerator).descriptor_);
    bVar3 = MessageOptions::deprecated(pMVar6);
    pcVar7 = "";
    if (bVar3) {
      pcVar7 = "@java.lang.Deprecated ";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pcVar7,&local_e1);
    ExtraMessageOrBuilderInterfaces_abi_cxx11_
              (&local_108,(java *)(this->super_MessageGenerator).descriptor_,descriptor_01);
    psVar8 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i,"",(allocator<char> *)((long)&i_1 + 3));
    io::Printer::Print(pPVar2,
                       "$deprecation$public interface $classname$OrBuilder$idend$ extends\n    $extra_interfaces$\n    com.google.protobuf.MessageLiteOrBuilder {\n"
                       ,"deprecation",&local_e0,"extra_interfaces",&local_108,"classname",psVar8,
                       "idend",(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 3));
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  else {
    pMVar6 = Descriptor::options((this->super_MessageGenerator).descriptor_);
    bVar3 = MessageOptions::deprecated(pMVar6);
    pcVar7 = "";
    if (bVar3) {
      pcVar7 = "@java.lang.Deprecated ";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar7,&local_71);
    ExtraMessageOrBuilderInterfaces_abi_cxx11_
              (&local_98,(java *)(this->super_MessageGenerator).descriptor_,descriptor_00);
    psVar8 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
    io::Printer::Print(pPVar2,
                       "$deprecation$public interface $classname$OrBuilder$idend$ extends \n    $extra_interfaces$\n     com.google.protobuf.GeneratedMessageLite.\n          ExtendableMessageOrBuilder<\n              $classname$, $classname$.Builder> {\n"
                       ,"deprecation",&local_70,"extra_interfaces",&local_98,"classname",psVar8,
                       "idend",&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  io::Printer::Annotate<google::protobuf::Descriptor>
            (local_18,"classname","idend",(this->super_MessageGenerator).descriptor_);
  io::Printer::Indent(local_18);
  local_130 = 0;
  while( true ) {
    iVar4 = local_130;
    iVar5 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    if (iVar5 <= iVar4) break;
    io::Printer::Print(local_18,"\n");
    field = Descriptor::field((this->super_MessageGenerator).descriptor_,local_130);
    pIVar9 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,field);
    (*pIVar9->_vptr_ImmutableFieldLiteGenerator[4])(pIVar9,local_18);
    local_130 = local_130 + 1;
  }
  local_134 = 0;
  while( true ) {
    iVar4 = local_134;
    iVar5 = Descriptor::oneof_decl_count((this->super_MessageGenerator).descriptor_);
    pPVar2 = local_18;
    if (iVar5 <= iVar4) break;
    pCVar1 = this->context_;
    oneof = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_134);
    pOVar10 = Context::GetOneofGeneratorInfo(pCVar1,oneof);
    this_00 = Context::GetNameResolver(this->context_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_158,this_00,(this->super_MessageGenerator).descriptor_);
    io::Printer::Print(pPVar2,
                       "\npublic $classname$.$oneof_capitalized_name$Case get$oneof_capitalized_name$Case();\n"
                       ,"oneof_capitalized_name",&pOVar10->capitalized_name,"classname",&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    local_134 = local_134 + 1;
  }
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n");
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateInterface(io::Printer* printer) {
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true, "OrBuilder");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "$deprecation$public interface $classname$OrBuilder$idend$ extends \n"
        "    $extra_interfaces$\n"
        "     com.google.protobuf.GeneratedMessageLite.\n"
        "          ExtendableMessageOrBuilder<\n"
        "              $classname$, $classname$.Builder> {\n",
        "deprecation", descriptor_->options().deprecated() ?
            "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(),
        "idend", "");
  } else {
    printer->Print(
        "$deprecation$public interface $classname$OrBuilder$idend$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.MessageLiteOrBuilder {\n",
        "deprecation", descriptor_->options().deprecated() ?
            "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(),
        "idend", "");
  }
  printer->Annotate("classname", "idend", descriptor_);

  printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      printer->Print("\n");
      field_generators_.get(descriptor_->field(i))
                       .GenerateInterfaceMembers(printer);
    }
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      printer->Print(
          "\n"
          "public $classname$.$oneof_capitalized_name$Case "
          "get$oneof_capitalized_name$Case();\n",
          "oneof_capitalized_name",
          context_->GetOneofGeneratorInfo(
              descriptor_->oneof_decl(i))->capitalized_name,
          "classname",
          context_->GetNameResolver()->GetImmutableClassName(descriptor_));
    }
  printer->Outdent();

  printer->Print("}\n");
}